

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortFun.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int b;
  int a;
  int c;
  int local_2c;
  int local_28;
  int local_24;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter int a: ",0x14);
  std::istream::operator>>((istream *)&std::cin,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter int b: ",0x14);
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter int c: ",0x14);
  std::istream::operator>>((istream *)&std::cin,&local_24);
  iVar2 = local_28;
  iVar6 = local_2c;
  iVar5 = local_24;
  do {
    iVar1 = iVar2;
    iVar7 = iVar6;
    if (iVar6 < iVar2) {
      iVar1 = iVar6;
      iVar7 = iVar2;
      local_2c = iVar2;
      local_28 = iVar6;
    }
    iVar2 = iVar1;
    iVar6 = iVar7;
    iVar1 = iVar5;
    if (iVar5 < iVar7) {
      iVar6 = iVar5;
      iVar1 = iVar7;
      local_2c = iVar5;
      local_24 = iVar7;
    }
    iVar5 = iVar1;
  } while ((iVar6 < iVar2) || (iVar5 < iVar2 || iVar5 < iVar6));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sorted values: ",0xf);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  plVar4 = (long *)std::ostream::operator<<(poVar3,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar2 = local_24;
  iVar6 = local_28;
  iVar5 = local_2c;
  do {
    iVar1 = iVar2;
    iVar7 = iVar6;
    if (iVar6 < iVar2) {
      iVar1 = iVar6;
      iVar7 = iVar2;
      local_28 = iVar2;
      local_24 = iVar6;
    }
    iVar2 = iVar1;
    iVar6 = iVar7;
    iVar1 = iVar5;
    if (iVar5 < iVar7) {
      iVar6 = iVar5;
      iVar1 = iVar7;
      local_2c = iVar7;
      local_28 = iVar5;
    }
    iVar5 = iVar1;
  } while ((iVar6 < iVar2) || (iVar5 < iVar2 || iVar5 < iVar6));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sorted values (c, a, b): ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  plVar4 = (long *)std::ostream::operator<<(poVar3,local_2c);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    int a;
    int b;
    int c;

    cout << "Please enter int a: ";
    cin >> a;
    cout << "Please enter int b: ";
    cin >> b;
    cout << "Please enter int c: ";
    cin >> c;

    sort3(a, b, c);

    cout << "Sorted values: " << a << " " << b << " " << c << endl;

    sort3(c, a, b);

    cout << "Sorted values (c, a, b): " << c << " " << a << " " << b << endl;

}